

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDHash::Write(ON_SubDHash *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    bVar2 = this->m_hash_type == Unset;
    bVar3 = this->m_vertex_count == 0;
    bVar1 = ON_BinaryArchive::WriteBool(archive,bVar3 || bVar2);
    if ((!bVar3 && !bVar2) && bVar1) {
      bVar1 = ON_BinaryArchive::WriteChar(archive,this->m_hash_type);
      if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_vertex_count), bVar1)) &&
          (bVar1 = ON_SHA1_Hash::Write(&this->m_vertex_hash,archive), bVar1)) &&
         (((bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_edge_count), bVar1 &&
           (bVar1 = ON_SHA1_Hash::Write(&this->m_edge_hash,archive), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_face_count), bVar1)))) {
        bVar1 = ON_SHA1_Hash::Write(&this->m_face_hash,archive);
      }
      else {
        bVar1 = false;
      }
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_SubDHash::Write(class ON_BinaryArchive& archive) const
{
  if (false == archive.BeginWrite3dmAnonymousChunk(1))
    return false;
  bool rc = false;
  for (;;)
  {
    const bool bIsEmpty = IsEmpty();
    if (false == archive.WriteBool(bIsEmpty))
      break;
    if (bIsEmpty)
    {
      rc = true;
      break;
    }
    // The SubD runtime serial number and geometry content serial numbers are runtime values.
    // When appropriate, calling contexts need to take appropriate steps when writing and 
    // set these after reading.
    const unsigned char hash_type_as_unsigned = static_cast<unsigned char>(m_hash_type);
    if (false == archive.WriteChar(hash_type_as_unsigned))
      break;
    if (false == archive.WriteInt(m_vertex_count))
      break;
    if (false == this->m_vertex_hash.Write(archive))
      break;
    if (false == archive.WriteInt(m_edge_count))
      break;
    if (false == this->m_edge_hash.Write(archive))
      break;
    if (false == archive.WriteInt(m_face_count))
      break;
    if (false == this->m_face_hash.Write(archive))
      break;
    rc = true;
    break;
  }
  if (false == archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}